

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestInfo::TestInfo
          (TestInfo *this,string *a_test_suite_name,string *a_name,char *a_type_param,
          char *a_value_param,CodeLocation *a_code_location,TypeId fixture_class_id,
          TestFactoryBase *factory)

{
  long in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  CodeLocation *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  bool bVar1;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  CodeLocation *in_stack_ffffffffffffff78;
  TestResult *in_stack_ffffffffffffff80;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  allocator<char> *__s;
  allocator<char> local_33;
  byte local_32;
  allocator<char> local_31 [9];
  CodeLocation *local_28;
  long local_20;
  string *local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,local_18);
  local_32 = 0;
  if (local_20 == 0) {
    __s = (allocator<char> *)0x0;
  }
  else {
    in_stack_ffffffffffffffa0 = (allocator<char> *)operator_new(0x20);
    std::allocator<char>::allocator();
    local_32 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_R9,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    __s = in_stack_ffffffffffffffa0;
  }
  std::unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>::
  unique_ptr<std::default_delete<std::__cxx11::string_const>,void>
            ((unique_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->file);
  if ((local_32 & 1) != 0) {
    std::allocator<char>::~allocator(local_31);
  }
  bVar1 = local_28 != (CodeLocation *)0x0;
  if (bVar1) {
    in_stack_ffffffffffffff80 = (TestResult *)operator_new(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_R9,(char *)__s,in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffff78 = local_28;
  }
  std::unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>::
  unique_ptr<std::default_delete<std::__cxx11::string_const>,void>
            ((unique_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->file);
  if (bVar1) {
    std::allocator<char>::~allocator(&local_33);
  }
  internal::CodeLocation::CodeLocation
            ((CodeLocation *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *(undefined8 *)(in_RDI + 0x78) = in_stack_00000008;
  in_RDI[0x80] = (string)0x0;
  in_RDI[0x81] = (string)0x0;
  in_RDI[0x82] = (string)0x0;
  in_RDI[0x83] = (string)0x0;
  *(undefined8 *)(in_RDI + 0x88) = in_stack_00000010;
  TestResult::TestResult(in_stack_ffffffffffffff80);
  return;
}

Assistant:

TestInfo::TestInfo(const std::string& a_test_suite_name,
                   const std::string& a_name, const char* a_type_param,
                   const char* a_value_param,
                   internal::CodeLocation a_code_location,
                   internal::TypeId fixture_class_id,
                   internal::TestFactoryBase* factory)
    : test_suite_name_(a_test_suite_name),
      name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : nullptr),
      value_param_(a_value_param ? new std::string(a_value_param) : nullptr),
      location_(a_code_location),
      fixture_class_id_(fixture_class_id),
      should_run_(false),
      is_disabled_(false),
      matches_filter_(false),
      is_in_another_shard_(false),
      factory_(factory),
      result_() {}